

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O0

double __thiscall QVariant::toDouble(QVariant *this,bool *ok)

{
  bool *in_RDI;
  double dVar1;
  Private *unaff_retaddr;
  
  dVar1 = qNumVariantToHelper<double>(unaff_retaddr,in_RDI);
  return dVar1;
}

Assistant:

double QVariant::toDouble(bool *ok) const
{
    return qNumVariantToHelper<double>(d, ok);
}